

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::IsReadyForCheckingDescriptorExtDecl
          (DescriptorPool *this,string_view message_name)

{
  bool bVar1;
  int iVar2;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_00;
  long lVar3;
  undefined **ppuVar4;
  char **ppcVar5;
  byte bVar6;
  allocator_type local_73;
  key_equal local_72;
  hasher local_71;
  string_view message_name_local;
  char *local_60 [10];
  
  message_name_local._M_str = message_name._M_str;
  message_name_local._M_len = message_name._M_len;
  bVar6 = 0;
  if (IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                                 ::kDescriptorTypes_abi_cxx11_);
    if (iVar2 != 0) {
      this_00 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                 *)operator_new(0x20);
      ppuVar4 = &PTR_anon_var_dwarf_24b833_004add30;
      ppcVar5 = local_60;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppcVar5 = *ppuVar4;
        ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
        ppcVar5 = ppcVar5 + (ulong)bVar6 * -2 + 1;
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
      ::raw_hash_set<char_const*const*>
                (this_00,local_60,(char **)&stack0xfffffffffffffff0,0,&local_71,&local_72,&local_73)
      ;
      IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ =
           (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00;
      __cxa_guard_release(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                           ::kDescriptorTypes_abi_cxx11_);
    }
  }
  bVar1 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::contains<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                        ::kDescriptorTypes_abi_cxx11_,&message_name_local);
  return bVar1;
}

Assistant:

bool DescriptorPool::IsReadyForCheckingDescriptorExtDecl(
    absl::string_view message_name) const {
  static const auto& kDescriptorTypes = *new absl::flat_hash_set<std::string>({
      "google.protobuf.EnumOptions",
      "google.protobuf.EnumValueOptions",
      "google.protobuf.ExtensionRangeOptions",
      "google.protobuf.FieldOptions",
      "google.protobuf.FileOptions",
      "google.protobuf.MessageOptions",
      "google.protobuf.MethodOptions",
      "google.protobuf.OneofOptions",
      "google.protobuf.ServiceOptions",
      "google.protobuf.StreamOptions",
  });
  return kDescriptorTypes.contains(message_name);
}